

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall
kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::fork
          (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *this
          )

{
  uint *puVar1;
  __pid_t extraout_EAX;
  ForkHubBase *this_00;
  Refcounted *refcounted;
  Own<kj::_::PromiseNode> *in_RSI;
  
  this_00 = (ForkHubBase *)operator_new(0x1d0);
  (this_00->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006215b8;
  (this_00->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_006215f0;
  kj::_::ForkHubBase::ForkHubBase(this_00,in_RSI,(ExceptionOrValue *)(this_00 + 1));
  (this_00->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006215b8;
  (this_00->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_006215f0;
  *(undefined1 *)&this_00[1].super_Refcounted.super_Disposer._vptr_Disposer = 0;
  this_00[4].inner.ptr = (PromiseNode *)0x0;
  this_00[4].resultRef = (ExceptionOrValue *)0x0;
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (this->super_PromiseBase).node.disposer = (Disposer *)this_00;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)this_00;
  return extraout_EAX;
}

Assistant:

ForkedPromise<T> Promise<T>::fork() {
  return ForkedPromise<T>(false, refcounted<_::ForkHub<_::FixVoid<T>>>(kj::mv(node)));
}